

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrsubstructCondense.cpp
# Opt level: O1

void __thiscall
TPZDohrSubstructCondense<double>::TPZDohrSubstructCondense(TPZDohrSubstructCondense<double> *this)

{
  _Rb_tree_header *p_Var1;
  TPZReference *pTVar2;
  
  (this->super_TPZSavable)._vptr_TPZSavable = (_func_int **)&PTR__TPZDohrSubstructCondense_01a0d740;
  pTVar2 = (TPZReference *)operator_new(0x10);
  pTVar2->fPointer = (TPZMatRed<double,_TPZFMatrix<double>_> *)0x0;
  (pTVar2->fCounter).super___atomic_base<int>._M_i = 0;
  LOCK();
  (pTVar2->fCounter).super___atomic_base<int>._M_i = 1;
  UNLOCK();
  (this->fMatRedComplete).fRef = pTVar2;
  this->fNEquations = -1;
  this->fNumInternalEquations = -1;
  this->fNumExternalEquations = -1;
  (this->fCoarseNodes)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5b0;
  (this->fCoarseNodes).fStore = (int *)0x0;
  (this->fCoarseNodes).fNElements = 0;
  (this->fCoarseNodes).fNAlloc = 0;
  (this->fPhiC).super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 0;
  (this->fPhiC).super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 0;
  (this->fPhiC).super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  (this->fPhiC).super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  (this->fPhiC).super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0183c898;
  (this->fPhiC).fElem = (double *)0x0;
  (this->fPhiC).fGiven = (double *)0x0;
  (this->fPhiC).fSize = 0;
  TPZVec<int>::TPZVec(&(this->fPhiC).fPivot.super_TPZVec<int>,0);
  (this->fPhiC).fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  (this->fPhiC).fPivot.super_TPZVec<int>.fStore = (this->fPhiC).fPivot.fExtAlloc;
  (this->fPhiC).fPivot.super_TPZVec<int>.fNElements = 0;
  (this->fPhiC).fPivot.super_TPZVec<int>.fNAlloc = 0;
  (this->fPhiC).fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  (this->fPhiC).fWork.fStore = (double *)0x0;
  (this->fPhiC).fWork.fNElements = 0;
  (this->fPhiC).fWork.fNAlloc = 0;
  (this->fPhiC_Weighted_Condensed).super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 0;
  (this->fPhiC_Weighted_Condensed).super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 0;
  (this->fPhiC_Weighted_Condensed).super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  (this->fPhiC_Weighted_Condensed).super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  (this->fPhiC_Weighted_Condensed).super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_0183c898;
  (this->fPhiC_Weighted_Condensed).fElem = (double *)0x0;
  (this->fPhiC_Weighted_Condensed).fGiven = (double *)0x0;
  (this->fPhiC_Weighted_Condensed).fSize = 0;
  TPZVec<int>::TPZVec(&(this->fPhiC_Weighted_Condensed).fPivot.super_TPZVec<int>,0);
  (this->fPhiC_Weighted_Condensed).fPivot.super_TPZVec<int>._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_0183cde8;
  (this->fPhiC_Weighted_Condensed).fPivot.super_TPZVec<int>.fStore =
       (this->fPhiC_Weighted_Condensed).fPivot.fExtAlloc;
  (this->fPhiC_Weighted_Condensed).fPivot.super_TPZVec<int>.fNElements = 0;
  (this->fPhiC_Weighted_Condensed).fPivot.super_TPZVec<int>.fNAlloc = 0;
  (this->fPhiC_Weighted_Condensed).fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  (this->fPhiC_Weighted_Condensed).fWork.fStore = (double *)0x0;
  (this->fPhiC_Weighted_Condensed).fWork.fNElements = 0;
  (this->fPhiC_Weighted_Condensed).fWork.fNAlloc = 0;
  TPZManVector<double,_10>::TPZManVector(&this->fWeights,0);
  (this->fKCi).super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 0;
  (this->fKCi).super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 0;
  (this->fKCi).super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  (this->fKCi).super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  (this->fKCi).super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0183c898;
  (this->fKCi).fElem = (double *)0x0;
  (this->fKCi).fGiven = (double *)0x0;
  (this->fKCi).fSize = 0;
  TPZVec<int>::TPZVec(&(this->fKCi).fPivot.super_TPZVec<int>,0);
  (this->fKCi).fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  (this->fKCi).fPivot.super_TPZVec<int>.fStore = (this->fKCi).fPivot.fExtAlloc;
  (this->fKCi).fPivot.super_TPZVec<int>.fNElements = 0;
  (this->fKCi).fPivot.super_TPZVec<int>.fNAlloc = 0;
  (this->fKCi).fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  (this->fKCi).fWork.fStore = (double *)0x0;
  (this->fKCi).fWork.fNElements = 0;
  (this->fKCi).fWork.fNAlloc = 0;
  p_Var1 = &(this->fPermutationsScatter)._M_t._M_impl.super__Rb_tree_header;
  (this->fPermutationsScatter)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->fPermutationsScatter)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->fPermutationsScatter)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->fPermutationsScatter)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->fPermutationsScatter)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->wasRealloc = false;
  pTVar2 = (TPZReference *)operator_new(0x10);
  pTVar2->fPointer = (TPZMatRed<double,_TPZFMatrix<double>_> *)0x0;
  (pTVar2->fCounter).super___atomic_base<int>._M_i = 0;
  LOCK();
  (pTVar2->fCounter).super___atomic_base<int>._M_i = 1;
  UNLOCK();
  (this->fMatRed).fRef = pTVar2;
  (this->fLocalLoad).super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 0;
  (this->fLocalLoad).super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 0;
  (this->fLocalLoad).super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  (this->fLocalLoad).super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  (this->fLocalLoad).super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0183c898;
  (this->fLocalLoad).fElem = (double *)0x0;
  (this->fLocalLoad).fGiven = (double *)0x0;
  (this->fLocalLoad).fSize = 0;
  TPZVec<int>::TPZVec(&(this->fLocalLoad).fPivot.super_TPZVec<int>,0);
  (this->fLocalLoad).fPivot.super_TPZVec<int>._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_0183cde8;
  (this->fLocalLoad).fPivot.super_TPZVec<int>.fStore = (this->fLocalLoad).fPivot.fExtAlloc;
  (this->fLocalLoad).fPivot.super_TPZVec<int>.fNElements = 0;
  (this->fLocalLoad).fPivot.super_TPZVec<int>.fNAlloc = 0;
  (this->fLocalLoad).fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  (this->fLocalLoad).fWork.fStore = (double *)0x0;
  (this->fLocalLoad).fWork.fNElements = 0;
  (this->fLocalLoad).fWork.fNAlloc = 0;
  (this->fLocalWeightedResidual).super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 0;
  (this->fLocalWeightedResidual).super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 0;
  (this->fLocalWeightedResidual).super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  (this->fLocalWeightedResidual).super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  (this->fLocalWeightedResidual).super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_0183c898;
  (this->fLocalWeightedResidual).fElem = (double *)0x0;
  (this->fLocalWeightedResidual).fGiven = (double *)0x0;
  (this->fLocalWeightedResidual).fSize = 0;
  TPZVec<int>::TPZVec(&(this->fLocalWeightedResidual).fPivot.super_TPZVec<int>,0);
  (this->fLocalWeightedResidual).fPivot.super_TPZVec<int>._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_0183cde8;
  (this->fLocalWeightedResidual).fPivot.super_TPZVec<int>.fStore =
       (this->fLocalWeightedResidual).fPivot.fExtAlloc;
  (this->fLocalWeightedResidual).fPivot.super_TPZVec<int>.fNElements = 0;
  (this->fLocalWeightedResidual).fPivot.super_TPZVec<int>.fNAlloc = 0;
  (this->fLocalWeightedResidual).fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  (this->fLocalWeightedResidual).fWork.fStore = (double *)0x0;
  (this->fLocalWeightedResidual).fWork.fNElements = 0;
  (this->fLocalWeightedResidual).fWork.fNAlloc = 0;
  (this->fAdjustSolution).super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 0;
  (this->fAdjustSolution).super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 0;
  (this->fAdjustSolution).super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  (this->fAdjustSolution).super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  (this->fAdjustSolution).super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_0183c898;
  (this->fAdjustSolution).fElem = (double *)0x0;
  (this->fAdjustSolution).fGiven = (double *)0x0;
  (this->fAdjustSolution).fSize = 0;
  TPZVec<int>::TPZVec(&(this->fAdjustSolution).fPivot.super_TPZVec<int>,0);
  (this->fAdjustSolution).fPivot.super_TPZVec<int>._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_0183cde8;
  (this->fAdjustSolution).fPivot.super_TPZVec<int>.fStore = (this->fAdjustSolution).fPivot.fExtAlloc
  ;
  (this->fAdjustSolution).fPivot.super_TPZVec<int>.fNElements = 0;
  (this->fAdjustSolution).fPivot.super_TPZVec<int>.fNAlloc = 0;
  (this->fAdjustSolution).fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  (this->fAdjustSolution).fWork.fStore = (double *)0x0;
  (this->fAdjustSolution).fWork.fNElements = 0;
  (this->fAdjustSolution).fWork.fNAlloc = 0;
  return;
}

Assistant:

TPZDohrSubstructCondense<TVar>::TPZDohrSubstructCondense() : fNEquations(-1), fNumInternalEquations(-1), fNumExternalEquations(-1), wasRealloc(false)
{
	//Inicializacao
}